

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * get_full_name(c2m_ctx_t c2m_ctx,char *base,char *name,int dir_base_p)

{
  size_t sVar1;
  char *pcVar2;
  size_t len;
  char *slash2;
  char *slash;
  char *last2;
  char *last;
  char *str;
  int dir_base_p_local;
  char *name_local;
  char *base_local;
  c2m_ctx_t c2m_ctx_local;
  
  VARR_chartrunc(c2m_ctx->temp_string,0);
  if ((base == (char *)0x0) || (*base == '\0')) {
    if ((name == (char *)0x0) || (c2m_ctx_local = (c2m_ctx_t)name, *name == '\0')) {
      __assert_fail("name != NULL && name[0] != \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x97c,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
    }
  }
  else {
    if (dir_base_p == 0) {
      pcVar2 = strrchr(base,0x2f);
      last = base;
      if (pcVar2 == (char *)0x0) {
        add_to_temp_string(c2m_ctx,".");
        add_to_temp_string(c2m_ctx,"/");
      }
      else {
        for (; last <= pcVar2; last = last + 1) {
          VARR_charpush(c2m_ctx->temp_string,*last);
        }
        VARR_charpush(c2m_ctx->temp_string,'\0');
      }
    }
    else {
      sVar1 = strlen(base);
      if (sVar1 == 0) {
        __assert_fail("len > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x984,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)"
                     );
      }
      add_to_temp_string(c2m_ctx,base);
      if (base[sVar1 - 1] != '/') {
        add_to_temp_string(c2m_ctx,"/");
      }
    }
    add_to_temp_string(c2m_ctx,name);
    c2m_ctx_local = (c2m_ctx_t)VARR_charaddr(c2m_ctx->temp_string);
  }
  return (char *)c2m_ctx_local;
}

Assistant:

static const char *get_full_name (c2m_ctx_t c2m_ctx, const char *base, const char *name,
                                  int dir_base_p) {
  const char *str, *last, *last2, *slash = "/", *slash2 = NULL;
  size_t len;

  VARR_TRUNC (char, temp_string, 0);
  if (base == NULL || *base == '\0') {
    assert (name != NULL && name[0] != '\0');
    return name;
  }
#ifdef _WIN32
  slash2 = "\\";
#endif
  if (dir_base_p) {
    len = strlen (base);
    assert (len > 0);
    add_to_temp_string (c2m_ctx, base);
    if (base[len - 1] != slash[0]) add_to_temp_string (c2m_ctx, slash);
  } else {
    last = strrchr (base, slash[0]);
    last2 = slash2 != NULL ? strrchr (base, slash2[0]) : NULL;
    if (last2 != NULL && (last == NULL || last2 > last)) last = last2;
    if (last != NULL) {
      for (str = base; str <= last; str++) VARR_PUSH (char, temp_string, *str);
      VARR_PUSH (char, temp_string, '\0');
    } else {
      add_to_temp_string (c2m_ctx, ".");
      add_to_temp_string (c2m_ctx, slash);
    }
  }
  add_to_temp_string (c2m_ctx, name);
  return VARR_ADDR (char, temp_string);
}